

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::preprocessInclude(TraverseSchema *this,DOMElement *elem)

{
  XSDLocator *this_00;
  SchemaInfo *pSVar1;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *this_01;
  bool bVar2;
  int iVar3;
  uint uriId;
  DOMElement *pDVar4;
  XMLSize_t XVar5;
  XSAnnotation *pXVar6;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  XMLFileLoc lineNo;
  XMLFileLoc columnNo;
  undefined4 extraout_var;
  XSDDOMParser *this_02;
  DOMDocument *pDVar9;
  undefined4 extraout_var_00;
  XMLCh *str1;
  undefined4 extraout_var_02;
  SchemaInfo *this_03;
  NamespaceScope *pNVar10;
  SchemaInfo *saveInfo;
  XMLCh *targetNSURIString;
  DOMElement *root;
  DOMDocument *document;
  SchemaInfo *pSStack_68;
  bool flag;
  SchemaInfo *includeSchemaInfo;
  XMLCh *includeURL;
  Janitor<xercesc_4_0::InputSource> janSrc;
  InputSource *srcToFill;
  XMLCh *schemaLocation;
  undefined1 local_28 [8];
  NamespaceScopeManager nsMgr;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  undefined4 extraout_var_01;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)elem;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)local_28,elem,this->fSchemaInfo,this);
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,(DOMElement *)nsMgr.fSchemaInfo,0x19,this,true,
             this->fNonXSAttList);
  pSVar1 = nsMgr.fSchemaInfo;
  pDVar4 = XUtil::getFirstChildElement((DOMNode *)nsMgr.fSchemaInfo);
  pDVar4 = checkContent(this,(DOMElement *)pSVar1,pDVar4,true,true);
  if (pDVar4 != (DOMElement *)0x0) {
    reportSchemaError(this,(DOMElement *)nsMgr.fSchemaInfo,(XMLCh *)XMLUni::fgXMLErrDomain,0x4d);
  }
  if (this->fAnnotation == (XSAnnotation *)0x0) {
    bVar2 = XMLScanner::getGenerateSyntheticAnnotations(this->fScanner);
    if ((bVar2) &&
       (XVar5 = ValueVectorOf<xercesc_4_0::DOMNode_*>::size(this->fNonXSAttList), XVar5 != 0)) {
      pXVar6 = generateSyntheticAnnotation(this,(DOMElement *)nsMgr.fSchemaInfo,this->fNonXSAttList)
      ;
      this->fAnnotation = pXVar6;
      SchemaGrammar::addAnnotation(this->fSchemaGrammar,this->fAnnotation);
    }
  }
  else {
    SchemaGrammar::addAnnotation(this->fSchemaGrammar,this->fAnnotation);
  }
  pXVar7 = getElementAttValue(this,(DOMElement *)nsMgr.fSchemaInfo,
                              (XMLCh *)SchemaSymbols::fgATT_SCHEMALOCATION,AnyURI);
  if ((pXVar7 == (XMLCh *)0x0) || (*pXVar7 == L'\0')) {
    reportSchemaError(this,(DOMElement *)nsMgr.fSchemaInfo,(XMLCh *)XMLUni::fgXMLErrDomain,0x4b,
                      (XMLCh *)SchemaSymbols::fgELT_INCLUDE,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  else {
    this_00 = this->fLocator;
    pXVar8 = SchemaInfo::getCurrentSchemaURL(this->fSchemaInfo);
    lineNo = XSDElementNSImpl::getLineNo((XSDElementNSImpl *)nsMgr.fSchemaInfo);
    columnNo = XSDElementNSImpl::getColumnNo((XSDElementNSImpl *)nsMgr.fSchemaInfo);
    XSDLocator::setValues(this_00,pXVar8,(XMLCh *)0x0,lineNo,columnNo);
    janSrc.fData = resolveSchemaLocation(this,pXVar7,SchemaInclude,(XMLCh *)0x0);
    Janitor<xercesc_4_0::InputSource>::Janitor
              ((Janitor<xercesc_4_0::InputSource> *)&includeURL,janSrc.fData);
    if (janSrc.fData != (InputSource *)0x0) {
      iVar3 = (*(janSrc.fData)->_vptr_InputSource[5])();
      pXVar8 = (XMLCh *)CONCAT44(extraout_var,iVar3);
      pSStack_68 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                             (this->fCachedSchemaInfoList,pXVar8,this->fTargetNSURI);
      if ((pSStack_68 == (SchemaInfo *)0x0) &&
         (this->fSchemaInfoList != this->fCachedSchemaInfoList)) {
        pSStack_68 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                               (this->fSchemaInfoList,pXVar8,this->fTargetNSURI);
      }
      if (pSStack_68 == (SchemaInfo *)0x0) {
        if (this->fParser == (XSDDOMParser *)0x0) {
          this_02 = (XSDDOMParser *)XMemory::operator_new(0x178,this->fGrammarPoolMemoryManager);
          XSDDOMParser::XSDDOMParser
                    (this_02,(XMLValidator *)0x0,this->fGrammarPoolMemoryManager,
                     (XMLGrammarPool *)0x0);
          this->fParser = this_02;
        }
        AbstractDOMParser::setValidationScheme((AbstractDOMParser *)this->fParser,Val_Never);
        AbstractDOMParser::setDoNamespaces((AbstractDOMParser *)this->fParser,true);
        XSDDOMParser::setUserEntityHandler(this->fParser,this->fEntityHandler);
        XSDDOMParser::setUserErrorReporter(this->fParser,this->fErrorReporter);
        iVar3 = (*(janSrc.fData)->_vptr_InputSource[6])();
        (*(janSrc.fData)->_vptr_InputSource[10])(janSrc.fData,0);
        AbstractDOMParser::parse((AbstractDOMParser *)this->fParser,janSrc.fData);
        (*(janSrc.fData)->_vptr_InputSource[10])(janSrc.fData,(ulong)((byte)iVar3 & 1));
        bVar2 = XSDDOMParser::getSawFatal(this->fParser);
        if ((bVar2) && (bVar2 = XMLScanner::getExitOnFirstFatal(this->fScanner), bVar2)) {
          reportSchemaError(this,(DOMElement *)nsMgr.fSchemaInfo,(XMLCh *)XMLUni::fgXMLErrDomain,
                            0x105);
        }
        pDVar9 = AbstractDOMParser::getDocument((AbstractDOMParser *)this->fParser);
        if (pDVar9 != (DOMDocument *)0x0) {
          iVar3 = (*(pDVar9->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xd])();
          pDVar4 = (DOMElement *)CONCAT44(extraout_var_00,iVar3);
          if (pDVar4 != (DOMElement *)0x0) {
            iVar3 = (*(pDVar4->super_DOMNode)._vptr_DOMNode[0x29])
                              (pDVar4,SchemaSymbols::fgATT_TARGETNAMESPACE);
            str1 = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
            if ((*str1 == L'\0') ||
               (bVar2 = XMLString::equals(str1,this->fTargetNSURIString), bVar2)) {
              if (((*str1 == L'\0') &&
                  (iVar3 = (*(pDVar4->super_DOMNode)._vptr_DOMNode[0x2a])
                                     (pDVar4,XMLUni::fgXMLNSString),
                  CONCAT44(extraout_var_02,iVar3) == 0)) &&
                 (this->fTargetNSURI != this->fEmptyNamespaceURI)) {
                (*(pDVar4->super_DOMNode)._vptr_DOMNode[0x2c])
                          (pDVar4,XMLUni::fgXMLNSString,this->fTargetNSURIString);
              }
              pSVar1 = this->fSchemaInfo;
              this_03 = (SchemaInfo *)XMemory::operator_new(0xe8,this->fMemoryManager);
              SchemaInfo::SchemaInfo
                        (this_03,0,0,0,this->fTargetNSURI,(NamespaceScope *)0x0,pXVar8,
                         this->fTargetNSURIString,pDVar4,this->fScanner,
                         this->fGrammarPoolMemoryManager);
              this->fSchemaInfo = this_03;
              pNVar10 = SchemaInfo::getNamespaceScope(this->fSchemaInfo);
              NamespaceScope::reset(pNVar10,this->fEmptyNamespaceURI);
              pNVar10 = SchemaInfo::getNamespaceScope(this->fSchemaInfo);
              uriId = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                                (this->fURIStringPool,XMLUni::fgXMLURIName);
              NamespaceScope::addPrefix(pNVar10,L"xml",uriId);
              this_01 = this->fSchemaInfoList;
              pXVar7 = SchemaInfo::getCurrentSchemaURL(this->fSchemaInfo);
              iVar3 = SchemaInfo::getTargetNSURI(this->fSchemaInfo);
              RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::put
                        (this_01,pXVar7,iVar3,this->fSchemaInfo);
              RefHashTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::PtrHasher>::put
                        (this->fPreprocessedNodes,nsMgr.fSchemaInfo,this->fSchemaInfo);
              SchemaInfo::addSchemaInfo(pSVar1,this->fSchemaInfo,INCLUDE);
              traverseSchemaHeader(this,pDVar4);
              preprocessChildren(this,pDVar4);
              this->fSchemaInfo = pSVar1;
            }
            else {
              reportSchemaError(this,pDVar4,(XMLCh *)XMLUni::fgXMLErrDomain,0x4c,pXVar7,str1,
                                (XMLCh *)0x0,(XMLCh *)0x0);
            }
          }
        }
      }
      else {
        SchemaInfo::addSchemaInfo(this->fSchemaInfo,pSStack_68,INCLUDE);
      }
    }
    Janitor<xercesc_4_0::InputSource>::~Janitor((Janitor<xercesc_4_0::InputSource> *)&includeURL);
  }
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)local_28);
  return;
}

Assistant:

void TraverseSchema::preprocessInclude(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_Include, this, true, fNonXSAttList);

    // -----------------------------------------------------------------------
    // First, handle any ANNOTATION declaration
    // -----------------------------------------------------------------------
    if (checkContent(elem, XUtil::getFirstChildElement(elem), true) != 0)
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::OnlyAnnotationExpected);

    if (fAnnotation)
        fSchemaGrammar->addAnnotation(fAnnotation);
    else if (fScanner->getGenerateSyntheticAnnotations() && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
        fSchemaGrammar->addAnnotation(fAnnotation);
    }

    // -----------------------------------------------------------------------
    // Get 'schemaLocation' attribute
    // -----------------------------------------------------------------------
    const XMLCh* schemaLocation = getElementAttValue(elem, SchemaSymbols::fgATT_SCHEMALOCATION, DatatypeValidator::AnyURI);

    if (!schemaLocation || !*schemaLocation) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DeclarationNoSchemaLocation, SchemaSymbols::fgELT_INCLUDE);
        return;
    }

    // ------------------------------------------------------------------
    // Resolve schema location
    // ------------------------------------------------------------------
    fLocator->setValues(fSchemaInfo->getCurrentSchemaURL(), 0,
                        ((XSDElementNSImpl*) elem)->getLineNo(),
                        ((XSDElementNSImpl*) elem)->getColumnNo());
    InputSource* srcToFill = resolveSchemaLocation(schemaLocation,
            XMLResourceIdentifier::SchemaInclude);
    Janitor<InputSource> janSrc(srcToFill);

    // Nothing to do
    if (!srcToFill) {
        return;
    }

    const XMLCh* includeURL = srcToFill->getSystemId();
    SchemaInfo* includeSchemaInfo = fCachedSchemaInfoList->get(includeURL, fTargetNSURI);

    if (!includeSchemaInfo && fSchemaInfoList != fCachedSchemaInfoList)
      includeSchemaInfo = fSchemaInfoList->get(includeURL, fTargetNSURI);

    if (includeSchemaInfo) {

        fSchemaInfo->addSchemaInfo(includeSchemaInfo, SchemaInfo::INCLUDE);
        return;
    }

    // ------------------------------------------------------------------
    // Parse input source
    // ------------------------------------------------------------------
    if (!fParser)
        fParser = new (fGrammarPoolMemoryManager) XSDDOMParser(0, fGrammarPoolMemoryManager, 0);

    fParser->setValidationScheme(XercesDOMParser::Val_Never);
    fParser->setDoNamespaces(true);
    fParser->setUserEntityHandler(fEntityHandler);
    fParser->setUserErrorReporter(fErrorReporter);

    // Should just issue warning if the schema is not found
    bool flag = srcToFill->getIssueFatalErrorIfNotFound();
    srcToFill->setIssueFatalErrorIfNotFound(false);

    fParser->parse(*srcToFill);

    // Reset the InputSource
    srcToFill->setIssueFatalErrorIfNotFound(flag);

    if (fParser->getSawFatal() && fScanner->getExitOnFirstFatal())
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::SchemaScanFatalError);

    // ------------------------------------------------------------------
    // Get root element
    // ------------------------------------------------------------------
    DOMDocument* document = fParser->getDocument();

    if (document) {

        DOMElement* root = document->getDocumentElement();

        if (root) {

            const XMLCh* targetNSURIString = root->getAttribute(SchemaSymbols::fgATT_TARGETNAMESPACE);

            // check to see if targetNameSpace is right
            if (*targetNSURIString
                && !XMLString::equals(targetNSURIString,fTargetNSURIString)){
                reportSchemaError(root, XMLUni::fgXMLErrDomain, XMLErrs::IncludeNamespaceDifference,
                                  schemaLocation, targetNSURIString);
                return;
            }

            // if targetNamespace is empty, change it to includ'g schema
            // targetNamespace
            if (!*targetNSURIString && root->getAttributeNode(XMLUni::fgXMLNSString) == 0
                && fTargetNSURI != fEmptyNamespaceURI) {
                root->setAttribute(XMLUni::fgXMLNSString, fTargetNSURIString);
            }

            // --------------------------------------------------------
            // Update schema information with included schema
            // --------------------------------------------------------
            SchemaInfo* saveInfo = fSchemaInfo;

            fSchemaInfo = new (fMemoryManager) SchemaInfo(0, 0, 0, fTargetNSURI,
                                         0,
                                         includeURL,
                                         fTargetNSURIString, root,
                                         fScanner,
                                         fGrammarPoolMemoryManager);

            fSchemaInfo->getNamespaceScope()->reset(fEmptyNamespaceURI);
            // Add mapping for the xml prefix
            fSchemaInfo->getNamespaceScope()->addPrefix(XMLUni::fgXMLString, fURIStringPool->addOrFind(XMLUni::fgXMLURIName));

            fSchemaInfoList->put((void*) fSchemaInfo->getCurrentSchemaURL(),
                                 fSchemaInfo->getTargetNSURI(), fSchemaInfo);
            fPreprocessedNodes->put((void*) elem, fSchemaInfo);
            saveInfo->addSchemaInfo(fSchemaInfo, SchemaInfo::INCLUDE);
            traverseSchemaHeader(root);
            preprocessChildren(root);
            fSchemaInfo = saveInfo;
        }
    }
}